

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticEngine.cpp
# Opt level: O2

string * __thiscall
slang::DiagnosticEngine::formatMessage_abi_cxx11_
          (string *__return_storage_ptr__,DiagnosticEngine *this,Diagnostic *diag)

{
  long *plVar1;
  pointer pvVar2;
  __index_type _Var3;
  FormatterMap *__range1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
  *arg;
  pointer pvVar4;
  vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
  *__range1_1;
  string_view sVar5;
  basic_format_args<fmt::v11::context> bVar6;
  string_view fmt;
  format_args args_00;
  dynamic_format_arg_store<fmt::v11::context> args;
  anon_class_16_2_3fddba98 local_78;
  dynamic_format_arg_store<fmt::v11::context> local_68;
  
  if ((diag->args).
      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (diag->args).
      super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_68.data_.
    super__Vector_base<fmt::v11::basic_format_arg<fmt::v11::context>,_std::allocator<fmt::v11::basic_format_arg<fmt::v11::context>_>_>
    ._M_impl.super__Vector_impl_data._0_16_ = getMessage(this,diag->code);
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)__return_storage_ptr__,
               (basic_string_view<char,_std::char_traits<char>_> *)&local_68,
               (allocator<char> *)&local_78);
  }
  else {
    if ((this->formatters).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
        .size_ctrl.size == 0) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
      ::operator=((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                   *)&this->formatters,
                  (table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
                   *)&defaultFormatters);
    }
    local_68.data_.
    super__Vector_base<fmt::v11::basic_format_arg<fmt::v11::context>,_std::allocator<fmt::v11::basic_format_arg<fmt::v11::context>_>_>
    ._M_impl.super__Vector_impl_data._0_16_ =
         boost::unordered::detail::foa::
         table<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>_>_>
         ::begin(&(this->formatters).table_);
    while (local_68.data_.
           super__Vector_base<fmt::v11::basic_format_arg<fmt::v11::context>,_std::allocator<fmt::v11::basic_format_arg<fmt::v11::context>_>_>
           ._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
      plVar1 = *(long **)((long)&((local_68.data_.
                                   super__Vector_base<fmt::v11::basic_format_arg<fmt::v11::context>,_std::allocator<fmt::v11::basic_format_arg<fmt::v11::context>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish)->value_).field_0 + 8)
      ;
      (**(code **)(*plVar1 + 0x10))(plVar1,diag);
      boost::unordered::detail::foa::
      table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
      ::increment((table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
                   *)&local_68);
    }
    local_68.named_info_.
    super__Vector_base<fmt::v11::detail::named_arg_info<char>,_std::allocator<fmt::v11::detail::named_arg_info<char>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68.named_info_.
    super__Vector_base<fmt::v11::detail::named_arg_info<char>,_std::allocator<fmt::v11::detail::named_arg_info<char>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.data_.
    super__Vector_base<fmt::v11::basic_format_arg<fmt::v11::context>,_std::allocator<fmt::v11::basic_format_arg<fmt::v11::context>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68.named_info_.
    super__Vector_base<fmt::v11::detail::named_arg_info<char>,_std::allocator<fmt::v11::detail::named_arg_info<char>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68.data_.
    super__Vector_base<fmt::v11::basic_format_arg<fmt::v11::context>,_std::allocator<fmt::v11::basic_format_arg<fmt::v11::context>_>_>
    ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0);
    local_68.dynamic_args_.head_._M_t.
    super___uniq_ptr_impl<fmt::v11::detail::node<void>,_std::default_delete<fmt::v11::detail::node<void>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_fmt::v11::detail::node<void>_*,_std::default_delete<fmt::v11::detail::node<void>_>_>
    .super__Head_base<0UL,_fmt::v11::detail::node<void>_*,_false>._M_head_impl =
         (unique_ptr<fmt::v11::detail::node<void>,_std::default_delete<fmt::v11::detail::node<void>_>_>
          )(__uniq_ptr_data<fmt::v11::detail::node<void>,_std::default_delete<fmt::v11::detail::node<void>_>,_true,_true>
            )0x0;
    pvVar2 = (diag->args).
             super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pvVar4 = (diag->args).
                  super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; pvVar4 != pvVar2; pvVar4 = pvVar4 + 1)
    {
      _Var3 = (pvVar4->
              super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
              ).
              super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
              .
              super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
              .
              super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
              .
              super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
              .
              super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
              ._M_index;
      local_78.this = this;
      local_78.args = &local_68;
      if (_Var3 == 0xff) {
        std::__throw_bad_variant_access("std::visit: variant is valueless");
        _Var3 = (pvVar4->
                super__Variant_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                ).
                super__Move_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                .
                super__Copy_assign_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                .
                super__Move_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                .
                super__Copy_ctor_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                .
                super__Variant_storage_alias<std::__cxx11::basic_string<char>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>
                ._M_index;
      }
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/diagnostics/DiagnosticEngine.cpp:296:13)_&&,_const_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_&>
        ::_S_vtable._M_arr[(char)_Var3]._M_data)(&local_78,pvVar4);
    }
    sVar5 = getMessage(this,diag->code);
    bVar6 = ::fmt::v11::dynamic_format_arg_store::operator_cast_to_basic_format_args(&local_68);
    fmt.size_ = bVar6.desc_;
    fmt.data_ = (char *)sVar5._M_len;
    args_00.field_1.values_ = in_R9.values_;
    args_00.desc_ = (unsigned_long_long)bVar6.field_1.values_;
    ::fmt::v11::vformat_abi_cxx11_(__return_storage_ptr__,(v11 *)sVar5._M_str,fmt,args_00);
    ::fmt::v11::dynamic_format_arg_store<fmt::v11::context>::~dynamic_format_arg_store(&local_68);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string DiagnosticEngine::formatMessage(const Diagnostic& diag) const {
    // If we have no arguments, the format string is the entire message.
    if (diag.args.empty())
        return std::string(getMessage(diag.code));

    // Let each formatter have a look at the diagnostic before we begin.
    if (formatters.empty())
        formatters = defaultFormatters;

    for (auto& [key, formatter] : formatters)
        formatter->startMessage(diag);

    // Dynamically build up the list of arguments to pass to the formatting routines.
    fmt::dynamic_format_arg_store<fmt::format_context> args;
    for (auto& arg : diag.args) {
        // Unwrap the argument type (stored as a variant).
        std::visit(
            [&](auto&& t) {
                // If the argument is a pointer, the fmtlib API needs it unwrapped into a reference.
                using T = std::decay_t<decltype(t)>;
                if constexpr (std::is_same_v<Diagnostic::CustomArgType, T>) {
                    if (auto it = formatters.find(t.first); it != formatters.end())
                        args.push_back(it->second->format(t.second));
                    else
                        SLANG_THROW(std::runtime_error("No diagnostic formatter for type"));
                }
                else if constexpr (std::is_same_v<ConstantValue, T>) {
                    if (t.isReal())
                        args.push_back(double(t.real()));
                    else if (t.isShortReal())
                        args.push_back(float(t.shortReal()));
                    else
                        args.push_back(t.toString());
                }
                else {
                    args.push_back(t);
                }
            },
            arg);
    }

    return fmt::vformat(getMessage(diag.code), args);
}